

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::defaultListTags
               (ostream *out,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
               bool isFiltered)

{
  bool bVar1;
  ReusableStringStream *pRVar2;
  Column *pCVar3;
  size_t newIndent;
  size_type count;
  ostream *poVar4;
  StringRef label;
  pluralise local_128;
  string local_110;
  Column local_f0;
  undefined1 local_b8 [8];
  Column wrapper;
  string str;
  undefined1 local_50 [8];
  ReusableStringStream rss;
  TagInfo *tagCount;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *__range1;
  bool isFiltered_local;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags_local;
  ostream *out_local;
  
  if (isFiltered) {
    std::operator<<(out,"Tags for matching test cases:\n");
  }
  else {
    std::operator<<(out,"All available tags:\n");
  }
  __end1 = std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::begin(tags);
  tagCount = (TagInfo *)std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::end(tags);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                                *)&tagCount);
    if (!bVar1) break;
    rss.m_oss = (ostream *)
                __gnu_cxx::
                __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
                ::operator*(&__end1);
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_50);
    pRVar2 = ReusableStringStream::operator<<
                       ((ReusableStringStream *)local_50,(char (*) [3])0x416bfd);
    str.field_2._8_4_ = std::setw(2);
    pRVar2 = ReusableStringStream::operator<<(pRVar2,(_Setw *)((long)&str.field_2 + 8));
    pRVar2 = ReusableStringStream::operator<<(pRVar2,(unsigned_long *)(rss.m_oss + 0x30));
    ReusableStringStream::operator<<(pRVar2,(char (*) [3])0x416bfd);
    ReusableStringStream::str_abi_cxx11_
              ((string *)&wrapper.m_initialIndent,(ReusableStringStream *)local_50);
    TagInfo::all_abi_cxx11_(&local_110,(TagInfo *)rss.m_oss);
    TextFlow::Column::Column(&local_f0,&local_110);
    pCVar3 = TextFlow::Column::initialIndent(&local_f0,0);
    newIndent = std::__cxx11::string::size();
    pCVar3 = TextFlow::Column::indent(pCVar3,newIndent);
    pCVar3 = TextFlow::Column::width(pCVar3,0x46);
    TextFlow::Column::Column((Column *)local_b8,pCVar3);
    TextFlow::Column::~Column(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    poVar4 = std::operator<<(out,(string *)&wrapper.m_initialIndent);
    poVar4 = TextFlow::operator<<(poVar4,(Column *)local_b8);
    std::operator<<(poVar4,'\n');
    TextFlow::Column::~Column((Column *)local_b8);
    std::__cxx11::string::~string((string *)&wrapper.m_initialIndent);
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_50);
    __gnu_cxx::
    __normal_iterator<const_Catch::TagInfo_*,_std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>_>
    ::operator++(&__end1);
  }
  count = std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::size(tags);
  label = operator____sr("tag",3);
  pluralise::pluralise(&local_128,count,label);
  poVar4 = operator<<(out,&local_128);
  poVar4 = std::operator<<(poVar4,"\n\n");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void defaultListTags( std::ostream& out,
                          std::vector<TagInfo> const& tags,
                          bool isFiltered ) {
        if ( isFiltered ) {
            out << "Tags for matching test cases:\n";
        } else {
            out << "All available tags:\n";
        }

        for ( auto const& tagCount : tags ) {
            ReusableStringStream rss;
            rss << "  " << std::setw( 2 ) << tagCount.count << "  ";
            auto str = rss.str();
            auto wrapper = TextFlow::Column( tagCount.all() )
                               .initialIndent( 0 )
                               .indent( str.size() )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - 10 );
            out << str << wrapper << '\n';
        }
        out << pluralise(tags.size(), "tag"_sr) << "\n\n" << std::flush;
    }